

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O3

void Ivy_ManPrintStats(Ivy_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  
  printf("PI/PO = %d/%d ",(ulong)(uint)p->nObjs[1],(ulong)(uint)p->nObjs[2]);
  printf("A = %7d. ",(ulong)(uint)p->nObjs[5]);
  printf("L = %5d. ",(ulong)(uint)p->nObjs[4]);
  printf("MaxID = %7d. ",(ulong)(p->vObjs->nSize - 1));
  uVar2 = 0xffffffff;
  if (p->nObjs[4] == 0) {
    uVar1 = Ivy_ManLevels(p);
    uVar2 = (ulong)uVar1;
  }
  printf("Lev = %3d. ",uVar2);
  putchar(10);
  fflush(_stdout);
}

Assistant:

void Ivy_ManPrintStats( Ivy_Man_t * p )
{
    printf( "PI/PO = %d/%d ", Ivy_ManPiNum(p), Ivy_ManPoNum(p) );
    printf( "A = %7d. ",       Ivy_ManAndNum(p) );
    printf( "L = %5d. ",       Ivy_ManLatchNum(p) );
//    printf( "X = %d. ",       Ivy_ManExorNum(p) );
//    printf( "B = %3d. ",       Ivy_ManBufNum(p) );
    printf( "MaxID = %7d. ",   Ivy_ManObjIdMax(p) );
//    printf( "Cre = %d. ",     p->nCreated );
//    printf( "Del = %d. ",     p->nDeleted );
    printf( "Lev = %3d. ",     Ivy_ManLatchNum(p)? -1 : Ivy_ManLevels(p) );
    printf( "\n" );
    fflush( stdout );
}